

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DecodeSamplerCase::setupTest(DecodeSamplerCase *this)

{
  pointer *pppSVar1;
  GLuint GVar2;
  glSamplerParameteriFunc p_Var3;
  int iVar4;
  deUint32 dVar5;
  GLenum err;
  SRGBTestSampler *pSVar6;
  undefined4 extraout_var;
  ulong uVar7;
  pointer ppSVar8;
  pointer __src;
  ulong uVar9;
  Vec4 *in_R8;
  WrapMode in_R9D;
  ulong uVar10;
  size_t __n;
  FragmentShaderParameters shaderParameters;
  WrapMode in_stack_ffffffffffffff28;
  FilterMode in_stack_ffffffffffffff30;
  undefined1 *local_b0 [2];
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  bool local_58;
  undefined1 *local_54;
  pointer local_48;
  pointer pbStack_40;
  pointer local_38;
  
  local_a0._M_p = (pointer)&local_90;
  local_b0[0] = &DAT_100000001;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_78._M_p = (pointer)&local_68;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_54 = &DAT_100000001;
  local_48 = (pointer)0x0;
  pbStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  local_58 = false;
  SRGBTestCase::addTexture
            (&this->super_SRGBTestCase,(TextureType)&stack0xffffffffffffff38,0,(int)local_78._M_p,
             in_R8,in_R9D,in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,0x3e4ccccd,0x3ecccccd)
  ;
  pSVar6 = (SRGBTestSampler *)operator_new(0x28);
  iVar4 = (*((this->super_SRGBTestCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  pSVar6->m_gl = (Functions *)CONCAT44(extraout_var,iVar4);
  pSVar6->m_wrapS = MIRRORED_REPEAT_GL;
  pSVar6->m_wrapT = MIRRORED_REPEAT_GL;
  *(undefined1 **)&pSVar6->m_minFilter = &DAT_100000001;
  pSVar6->m_isActive = false;
  (*((Functions *)CONCAT44(extraout_var,iVar4))->genSamplers)(1,&pSVar6->m_samplerHandle);
  p_Var3 = pSVar6->m_gl->samplerParameteri;
  GVar2 = pSVar6->m_samplerHandle;
  dVar5 = glu::getGLWrapMode(pSVar6->m_wrapS);
  (*p_Var3)(GVar2,0x2802,dVar5);
  p_Var3 = pSVar6->m_gl->samplerParameteri;
  GVar2 = pSVar6->m_samplerHandle;
  dVar5 = glu::getGLWrapMode(pSVar6->m_wrapT);
  (*p_Var3)(GVar2,0x2803,dVar5);
  p_Var3 = pSVar6->m_gl->samplerParameteri;
  GVar2 = pSVar6->m_samplerHandle;
  dVar5 = glu::getGLFilterMode(pSVar6->m_minFilter);
  (*p_Var3)(GVar2,0x2801,dVar5);
  p_Var3 = pSVar6->m_gl->samplerParameteri;
  GVar2 = pSVar6->m_samplerHandle;
  dVar5 = glu::getGLFilterMode(pSVar6->m_magFilter);
  (*p_Var3)(GVar2,0x2800,dVar5);
  (*pSVar6->m_gl->samplerParameteri)(pSVar6->m_samplerHandle,0x8a48,0x8a49);
  err = (*pSVar6->m_gl->getError)();
  glu::checkError(err,"samplerParameteri(m_samplerID, GL_TEXTURE_SRGB_DECODE_EXT, GL_DECODE_EXT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                  ,0x172);
  pSVar6->m_decoding = SRGBDECODE_DECODE;
  ppSVar8 = (this->super_SRGBTestCase).m_samplerList.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppSVar8 ==
      (this->super_SRGBTestCase).m_samplerList.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __src = (this->super_SRGBTestCase).m_samplerList.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
    __n = (long)ppSVar8 - (long)__src;
    if (__n == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar10 = (long)__n >> 3;
    uVar7 = 1;
    if (ppSVar8 != __src) {
      uVar7 = uVar10;
    }
    uVar9 = uVar7 + uVar10;
    if (0xffffffffffffffe < uVar9) {
      uVar9 = 0xfffffffffffffff;
    }
    if (CARRY8(uVar7,uVar10)) {
      uVar9 = 0xfffffffffffffff;
    }
    if (uVar9 == 0) {
      ppSVar8 = (pointer)0x0;
    }
    else {
      ppSVar8 = (pointer)operator_new(uVar9 * 8);
    }
    ppSVar8[uVar10] = pSVar6;
    if (0 < (long)__n) {
      memmove(ppSVar8,__src,__n);
    }
    if (__src != (pointer)0x0) {
      operator_delete(__src,(long)(this->super_SRGBTestCase).m_samplerList.
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__src);
    }
    (this->super_SRGBTestCase).m_samplerList.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
    ._M_impl.super__Vector_impl_data._M_start = ppSVar8;
    (this->super_SRGBTestCase).m_samplerList.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)ppSVar8 + __n + 8);
    (this->super_SRGBTestCase).m_samplerList.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = ppSVar8 + uVar9;
  }
  else {
    *ppSVar8 = pSVar6;
    pppSVar1 = &(this->super_SRGBTestCase).m_samplerList.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  SRGBTestCase::addShaderProgram(&this->super_SRGBTestCase,(FragmentShaderParameters *)local_b0);
  pSVar6 = *(this->super_SRGBTestCase).m_samplerList.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (*(this->super_SRGBTestCase).m_textureSourceList.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
    ._M_impl.super__Vector_impl_data._M_start)->m_hasSampler = true;
  pSVar6->m_textureUnit = 0;
  pSVar6->m_isActive = true;
  (this->super_SRGBTestCase).m_py = 0;
  (this->super_SRGBTestCase).m_samplingGroup = SHADERSAMPLINGGROUP_TEXTURE;
  (this->super_SRGBTestCase).m_px = 0;
  FragmentShaderParameters::~FragmentShaderParameters((FragmentShaderParameters *)local_b0);
  return;
}

Assistant:

void DecodeSamplerCase::setupTest (void)
{
	// TEST STEPS:
	//	- create and set texture_a to DECODE_SKIP_EXT
	//	- upload texture to the GPU and bind to sampler
	//	- sample texture using texture*()
	//	- read texel values back to the CPU
	//	- compare the texel values, should be in sampler format (linear)

	FragmentShaderParameters shaderParameters(SHADEROUTPUTS_ONE, SHADERUNIFORMS_ONE, NULL, BLENDING_NOT_REQUIRED, TOGGLING_NOT_REQUIRED);

	this->addTexture(	TEXTURETYPE_2D,
						TestDimensions::WIDTH,
						TestDimensions::HEIGHT,
						getColorReferenceLinear(),
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::LINEAR,
						tcu::Sampler::LINEAR,
						SRGBDECODE_SKIP_DECODE);

	this->addSampler(	tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::LINEAR,
						tcu::Sampler::LINEAR,
						SRGBDECODE_DECODE);

	this->addShaderProgram(shaderParameters);

	this->bindSamplerToTexture(0, 0, GL_TEXTURE0);
	this->activateSampler(0, true);

	this->setSamplingLocations(TestSamplingPositions::X_POS, TestSamplingPositions::Y_POS);
	this->setSamplingGroup(SHADERSAMPLINGGROUP_TEXTURE);
}